

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O2

string * pystring::os::path::join_posix
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *paths)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string b;
  
  pbVar1 = (paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)empty_string_abi_cxx11_)
    ;
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
    if ((long)pbVar2 - (long)pbVar1 != 0x20) {
      uVar4 = 1;
      while( true ) {
        pbVar1 = (paths->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(paths->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar4)
        break;
        std::__cxx11::string::string((string *)&b,(string *)(pbVar1 + uVar4));
        bVar3 = startswith(&b,(string *)forward_slash_abi_cxx11_,0,0x7fffffff);
        if (bVar3) {
          std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
        }
        else {
          if (__return_storage_ptr__->_M_string_length != 0) {
            bVar3 = endswith(__return_storage_ptr__,(string *)forward_slash_abi_cxx11_,0,0x7fffffff)
            ;
            if (!bVar3) {
              std::operator+(&local_70,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             forward_slash_abi_cxx11_,&b);
              std::__cxx11::string::append((string *)__return_storage_ptr__);
              std::__cxx11::string::~string((string *)&local_70);
              goto LAB_00109034;
            }
          }
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
LAB_00109034:
        std::__cxx11::string::~string((string *)&b);
        uVar4 = (ulong)((int)uVar4 + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join_posix(const std::vector< std::string > & paths)
    {
        if(paths.empty()) return empty_string;
        if(paths.size() == 1) return paths[0];
        
        std::string path = paths[0];
        
        for(unsigned int i=1; i<paths.size(); ++i)
        {
            std::string b = paths[i];
            if(pystring::startswith(b, forward_slash))
            {
                path = b;
            }
            else if(path.empty() || pystring::endswith(path, forward_slash))
            {
                path += b;
            }
            else
            {
                path += forward_slash + b;
            }
        }
        
        return path;
    }